

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoopThreadPool.cpp
# Opt level: O0

vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_> * __thiscall
sznet::net::KcpTcpEventLoopThreadPool::getAllLoops
          (vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
           *__return_storage_ptr__,KcpTcpEventLoopThreadPool *this)

{
  bool bVar1;
  allocator<sznet::net::KcpTcpEventLoop_*> local_19;
  KcpTcpEventLoopThreadPool *local_18;
  KcpTcpEventLoopThreadPool *this_local;
  
  local_18 = this;
  this_local = (KcpTcpEventLoopThreadPool *)__return_storage_ptr__;
  EventLoop::assertInLoopThread(&this->m_baseLoop->super_EventLoop);
  if ((this->m_started & 1U) != 0) {
    bVar1 = std::
            vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>::
            empty(&this->m_loops);
    if (bVar1) {
      std::allocator<sznet::net::KcpTcpEventLoop_*>::allocator(&local_19);
      std::vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>::
      vector(__return_storage_ptr__,1,&this->m_baseLoop,&local_19);
      std::allocator<sznet::net::KcpTcpEventLoop_*>::~allocator(&local_19);
    }
    else {
      std::vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>::
      vector(__return_storage_ptr__,&this->m_loops);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("m_started",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoopThreadPool.cpp"
                ,0x5b,
                "std::vector<KcpTcpEventLoop *> sznet::net::KcpTcpEventLoopThreadPool::getAllLoops()"
               );
}

Assistant:

std::vector<KcpTcpEventLoop*> KcpTcpEventLoopThreadPool::getAllLoops()
{
	m_baseLoop->assertInLoopThread();
	assert(m_started);
	if (m_loops.empty())
	{
		return std::vector<KcpTcpEventLoop*>(1, m_baseLoop);
	}
	else
	{
		return m_loops;
	}
}